

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

qpdf_offset_t __thiscall QPDF::maxEnd(QPDF *this,ObjUser *ou)

{
  size_type sVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  long lVar6;
  allocator<char> local_59;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  sVar1 = std::
          map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
          ::count(&((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_user_to_objects
                  ,ou);
  if (sVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"no entry in object user table for requested object user",
               &local_59);
    stopOnError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  pmVar2 = std::
           map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
           ::operator[](&((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                         obj_user_to_objects,ou);
  local_58 = &(pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header;
  lVar6 = 0;
  for (p_Var5 = (pmVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; p_Var5 != local_58;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    sVar3 = std::
            map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
            ::count(&((this->m)._M_t.
                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
                      .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                      super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                    (key_type *)(p_Var5 + 1));
    if (sVar3 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"unknown object referenced in object user table",&local_59);
      stopOnError(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pmVar4 = std::
             map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
             ::operator[](&((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->obj_cache,
                          (key_type *)(p_Var5 + 1));
    if (lVar6 <= pmVar4->end_after_space) {
      lVar6 = pmVar4->end_after_space;
    }
  }
  return lVar6;
}

Assistant:

qpdf_offset_t
QPDF::maxEnd(ObjUser const& ou)
{
    if (m->obj_user_to_objects.count(ou) == 0) {
        stopOnError("no entry in object user table for requested object user");
    }
    qpdf_offset_t end = 0;
    for (auto const& og: m->obj_user_to_objects[ou]) {
        if (!m->obj_cache.count(og)) {
            stopOnError("unknown object referenced in object user table");
        }
        end = std::max(end, m->obj_cache[og].end_after_space);
    }
    return end;
}